

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_map_key_boolean(void)

{
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  basic_variable<std::allocator<char>_> *local_340;
  basic_variable<std::allocator<char>_> *local_328;
  basic_variable<std::allocator<char>_> *local_310;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2f0;
  undefined1 local_2e4;
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  undefined1 auStack_278 [32];
  basic_variable<std::allocator<char>_> local_258;
  basic_variable<std::allocator<char>_> local_228;
  undefined1 auStack_1f8 [32];
  basic_variable<std::allocator<char>_> local_1d8;
  basic_variable<std::allocator<char>_> local_1a8;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  variable data_1;
  undefined1 local_12f;
  undefined1 local_12e [2];
  int local_12c;
  bool local_125 [13];
  int local_118;
  bool local_111;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_110;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_110 = &local_108;
  local_111 = false;
  local_118 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_110,&local_111,&local_118);
  local_110 = &local_a8;
  local_125[0] = true;
  local_12c = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<bool,_int,_true>(local_110,local_125,&local_12c);
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_2f0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_2f0 = local_2f0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_2f0);
  } while (local_2f0 != &local_108);
  local_12e[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_12f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xff,"void ctor_suite::construct_map_key_boolean()",local_12e,&local_12f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_2e1 = 1;
  auStack_1f8._24_8_ = &local_1d8;
  auStack_278._24_8_ = &local_258;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_278._24_8_,false);
  auStack_278._24_8_ = &local_228;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_278._24_8_,1);
  auStack_1f8._8_8_ = &local_258;
  auStack_1f8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_1f8 + 8));
  local_2e0 = &local_2d8;
  auStack_1f8._24_8_ = &local_1a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_2e0,true);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,2);
  auStack_278._8_8_ = &local_2d8;
  auStack_278._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_1a8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_278 + 8));
  local_2e1 = 0;
  local_178._0_8_ = &local_1d8;
  local_178._8_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_178);
  local_310 = (basic_variable<std::allocator<char>_> *)local_178;
  do {
    local_310 = local_310 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_310);
  } while (local_310 != &local_1d8);
  local_328 = (basic_variable<std::allocator<char>_> *)auStack_278;
  do {
    local_328 = local_328 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_328);
  } while (local_328 != &local_2d8);
  local_340 = (basic_variable<std::allocator<char>_> *)auStack_1f8;
  do {
    local_340 = local_340 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_340);
  } while (local_340 != &local_258);
  local_2e3[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_168);
  local_2e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x103,"void ctor_suite::construct_map_key_boolean()",local_2e3,&local_2e4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168);
  return;
}

Assistant:

void construct_map_key_boolean()
{
    {
        variable data(map::make({ {false, 1}, {true, 2} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
    {
        variable data({ {false, 1}, {true, 2} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
    }
}